

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint Entry;
  Vec_Int_t *vFanins_00;
  int *piVar7;
  Vec_Int_t *p_00;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  uint *__ptr;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  Wlc_Obj_t *pWVar15;
  long lVar16;
  
  if ((iObj < 0) || ((p->vCopies).nSize <= iObj)) goto LAB_0035e5f5;
  if ((p->vCopies).pArray[(uint)iObj] != 0) {
    return;
  }
  if ((iObj == 0) || (p->nObjsAlloc <= iObj)) goto LAB_0035e5d6;
  pWVar1 = p->pObjs + (uint)iObj;
  uVar13 = pWVar1->nFanins;
  uVar12 = (ulong)uVar13;
  if (0 < (int)uVar13) {
    lVar16 = 0;
    do {
      if ((2 < (uint)uVar12) ||
         (paVar8 = &pWVar1->field_10, (*(uint *)pWVar1 & 0x3f | 0x10) == 0x16)) {
        paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
      }
      Wlc_NtkMemBlast_rec(pNew,p,paVar8->Fanins[lVar16],vFanins);
      lVar16 = lVar16 + 1;
      uVar13 = pWVar1->nFanins;
      uVar12 = (ulong)(int)uVar13;
    } while (lVar16 < (long)uVar12);
  }
  if ((*(ushort *)pWVar1 & 0x3f) == 0x36) {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 0x10;
    p_00->nSize = 0;
    piVar7 = (int *)malloc(0x40);
    p_00->pArray = piVar7;
    paVar8 = &pWVar1->field_10;
    if (2 < uVar13) {
      paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
    }
    lVar16 = (long)paVar8->Fanins[0];
    if ((0 < lVar16) && (paVar8->Fanins[0] < p->nObjsAlloc)) {
      paVar8 = &pWVar1->field_10;
      if (2 < uVar13) {
        paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
      }
      uVar13 = paVar8->Fanins[1];
      lVar11 = (long)(int)uVar13;
      if ((lVar11 < 1) || ((uint)p->nObjsAlloc <= uVar13)) goto LAB_0035e5d6;
      pWVar2 = p->pObjs;
      iVar4 = pWVar1->End - pWVar1->Beg;
      iVar3 = -iVar4;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      iVar5 = pWVar2[lVar11].End - pWVar2[lVar11].Beg;
      iVar4 = -iVar5;
      if (0 < iVar5) {
        iVar4 = iVar5;
      }
      iVar9 = 2 << ((byte)iVar4 & 0x1f);
      iVar10 = pWVar2[lVar16].End - pWVar2[lVar16].Beg;
      iVar5 = -iVar10;
      if (0 < iVar10) {
        iVar5 = iVar10;
      }
      if (iVar3 + 1 << ((byte)iVar4 + 1 & 0x1f) != iVar5 + 1) {
        __assert_fail("nRegs * DataW == Wlc_ObjRange(pMem)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x73,"void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
      }
      vFanins->nSize = 0;
      if ((p->vCopies).nSize <= (int)uVar13) goto LAB_0035e5f5;
      Vec_IntPush(vFanins,(p->vCopies).pArray[lVar11]);
      if (0 < iVar9) {
        iVar4 = 0;
        do {
          uVar13 = Wlc_ObjAlloc(pNew,0x16,0,iVar3 + iVar4,iVar4);
          uVar6 = (int)((long)pWVar2 + (lVar16 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
          if (((int)uVar6 < 0) || ((p->vCopies).nSize <= (int)uVar6)) goto LAB_0035e5f5;
          iVar5 = (p->vCopies).pArray[uVar6 & 0x7fffffff];
          piVar7 = p_00->pArray;
          if (p_00->nCap < 1) {
            if (piVar7 == (int *)0x0) {
              piVar7 = (int *)malloc(4);
            }
            else {
              piVar7 = (int *)realloc(piVar7,4);
            }
            p_00->pArray = piVar7;
            if (piVar7 == (int *)0x0) goto LAB_0035e614;
            p_00->nCap = 1;
          }
          *piVar7 = iVar5;
          p_00->nSize = 1;
          Vec_IntPush(p_00,iVar3 + iVar4);
          Vec_IntPush(p_00,iVar4);
          if (((int)uVar13 < 1) || (pNew->nObjsAlloc <= (int)uVar13)) goto LAB_0035e5d6;
          Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar13,p_00);
          Vec_IntPush(vFanins,uVar13);
          iVar4 = iVar4 + iVar3 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      uVar13 = Wlc_ObjAlloc(pNew,8,0,iVar3,0);
      if (((int)uVar13 < 1) || (pNew->nObjsAlloc <= (int)uVar13)) goto LAB_0035e5d6;
      Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar13,vFanins);
      if ((p->vCopies).nSize <= iObj) goto LAB_0035e633;
      (p->vCopies).pArray[(uint)iObj] = uVar13;
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      goto LAB_0035e5ba;
    }
    goto LAB_0035e5d6;
  }
  if ((*(ushort *)pWVar1 & 0x3f) != 0x37) {
    Wlc_ObjDup(pNew,p,iObj,vFanins);
    return;
  }
  vFanins_00 = (Vec_Int_t *)malloc(0x10);
  vFanins_00->nCap = 0x10;
  vFanins_00->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  vFanins_00->pArray = piVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  if ((uVar13 < 3) && ((*(uint *)pWVar1 & 0x3f | 0x10) != 0x16)) {
    paVar8 = &pWVar1->field_10;
  }
  else {
    paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
  }
  lVar16 = (long)paVar8->Fanins[0];
  if ((lVar16 < 1) || (uVar6 = p->nObjsAlloc, (int)uVar6 <= paVar8->Fanins[0])) goto LAB_0035e5d6;
  pWVar2 = p->pObjs;
  if (uVar13 < 3) {
    if ((*(uint *)pWVar1 & 0x3f | 0x10) == 0x16) {
      uVar14 = (pWVar1->field_10).pFanins[0][1];
      if (((long)(int)uVar14 < 1) || (uVar6 <= uVar14)) goto LAB_0035e5d6;
      pWVar15 = pWVar2 + (int)uVar14;
      if (2 < uVar13) goto LAB_0035e015;
    }
    else {
      uVar13 = (pWVar1->field_10).Fanins[1];
      if (((long)(int)uVar13 < 1) || (uVar6 <= uVar13)) goto LAB_0035e5d6;
      pWVar15 = pWVar2 + (int)uVar13;
    }
    if ((*(uint *)pWVar1 & 0x3f | 0x10) == 0x16) goto LAB_0035e015;
    paVar8 = &pWVar1->field_10;
  }
  else {
    uVar13 = (pWVar1->field_10).pFanins[0][1];
    if (((long)(int)uVar13 < 1) || (uVar6 <= uVar13)) goto LAB_0035e5d6;
    pWVar15 = pWVar2 + (int)uVar13;
LAB_0035e015:
    paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
  }
  lVar11 = (long)paVar8[1].Fanins[0];
  if ((0 < lVar11) && ((uint)paVar8[1].Fanins[0] < uVar6)) {
    iVar4 = pWVar2[lVar11].End - pWVar2[lVar11].Beg;
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar5 = pWVar15->End - pWVar15->Beg;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    uVar13 = 2 << ((byte)iVar4 & 0x1f);
    iVar10 = iVar3 + 1 << ((byte)iVar4 + 1 & 0x1f);
    iVar5 = pWVar2[lVar16].End - pWVar2[lVar16].Beg;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    if (iVar10 != iVar4 + 1) {
      __assert_fail("nRegs * DataW == Wlc_ObjRange(pMem)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x42,"void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar9 = pWVar1->End - pWVar1->Beg;
    iVar5 = -iVar9;
    if (0 < iVar9) {
      iVar5 = iVar9;
    }
    if (iVar5 != iVar4) {
      __assert_fail("Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x43,"void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    uVar6 = Wlc_ObjAlloc(pNew,0x3a,0,uVar13 - 1,0);
    uVar14 = (int)((long)pWVar15 - (long)p->pObjs >> 3) * -0x55555555;
    if (((int)uVar14 < 0) || ((p->vCopies).nSize <= (int)uVar14)) {
LAB_0035e5f5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar4 = (p->vCopies).pArray[uVar14 & 0x7fffffff];
    piVar7 = vFanins_00->pArray;
    if (vFanins_00->nCap < 1) {
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc(4);
      }
      else {
        piVar7 = (int *)realloc(piVar7,4);
      }
      vFanins_00->pArray = piVar7;
      if (piVar7 == (int *)0x0) {
LAB_0035e614:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vFanins_00->nCap = 1;
    }
    *piVar7 = iVar4;
    vFanins_00->nSize = 1;
    if ((0 < (int)uVar6) && ((int)uVar6 < pNew->nObjsAlloc)) {
      Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar6,vFanins_00);
      if ((int)uVar13 < 1) {
        vFanins->nSize = 0;
      }
      else {
        uVar14 = 0;
        do {
          Entry = Wlc_ObjAlloc(pNew,0x16,0,uVar14,uVar14);
          __ptr = (uint *)vFanins_00->pArray;
          if (vFanins_00->nCap < 1) {
            if (__ptr == (uint *)0x0) {
              __ptr = (uint *)malloc(4);
            }
            else {
              __ptr = (uint *)realloc(__ptr,4);
            }
            vFanins_00->pArray = (int *)__ptr;
            if (__ptr == (uint *)0x0) goto LAB_0035e614;
            vFanins_00->nCap = 1;
          }
          *__ptr = uVar6;
          vFanins_00->nSize = 1;
          Vec_IntPush(vFanins_00,uVar14);
          Vec_IntPush(vFanins_00,uVar14);
          if (((int)Entry < 1) || (pNew->nObjsAlloc <= (int)Entry)) goto LAB_0035e5d6;
          Wlc_ObjAddFanins(pNew,pNew->pObjs + Entry,vFanins_00);
          Vec_IntPush(p_00,Entry);
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
        vFanins->nSize = 0;
        if (0 < (int)uVar13) {
          iVar4 = 0;
          uVar12 = (ulong)uVar13;
          do {
            uVar6 = Wlc_ObjAlloc(pNew,0x16,0,iVar3 + iVar4,iVar4);
            uVar14 = (int)((long)pWVar2 + (lVar16 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
            if (((int)uVar14 < 0) || ((p->vCopies).nSize <= (int)uVar14)) goto LAB_0035e5f5;
            iVar5 = (p->vCopies).pArray[uVar14 & 0x7fffffff];
            piVar7 = vFanins_00->pArray;
            if (vFanins_00->nCap < 1) {
              if (piVar7 == (int *)0x0) {
                piVar7 = (int *)malloc(4);
              }
              else {
                piVar7 = (int *)realloc(piVar7,4);
              }
              vFanins_00->pArray = piVar7;
              if (piVar7 == (int *)0x0) goto LAB_0035e614;
              vFanins_00->nCap = 1;
            }
            *piVar7 = iVar5;
            vFanins_00->nSize = 1;
            Vec_IntPush(vFanins_00,iVar3 + iVar4);
            Vec_IntPush(vFanins_00,iVar4);
            if (((int)uVar6 < 1) || (pNew->nObjsAlloc <= (int)uVar6)) goto LAB_0035e5d6;
            Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar6,vFanins_00);
            Vec_IntPush(vFanins,uVar6);
            iVar4 = iVar4 + iVar3 + 1;
            uVar6 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar6;
          } while (uVar6 != 0);
          if (0 < (int)uVar13) {
            uVar12 = 0;
            do {
              uVar6 = Wlc_ObjAlloc(pNew,8,0,iVar3,0);
              if ((long)p_00->nSize <= (long)uVar12) goto LAB_0035e5f5;
              iVar4 = p_00->pArray[uVar12];
              piVar7 = vFanins_00->pArray;
              if (vFanins_00->nCap < 1) {
                if (piVar7 == (int *)0x0) {
                  piVar7 = (int *)malloc(4);
                }
                else {
                  piVar7 = (int *)realloc(piVar7,4);
                }
                vFanins_00->pArray = piVar7;
                if (piVar7 == (int *)0x0) goto LAB_0035e614;
                vFanins_00->nCap = 1;
              }
              *piVar7 = iVar4;
              vFanins_00->nSize = 1;
              uVar14 = (int)((long)pWVar2 + (lVar11 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
              if ((((int)uVar14 < 0) || ((p->vCopies).nSize <= (int)uVar14)) ||
                 ((long)vFanins->nSize <= (long)uVar12)) goto LAB_0035e5f5;
              iVar4 = vFanins->pArray[uVar12];
              Vec_IntPush(vFanins_00,(p->vCopies).pArray[uVar14 & 0x7fffffff]);
              Vec_IntPush(vFanins_00,iVar4);
              if (((int)uVar6 < 1) || (pNew->nObjsAlloc <= (int)uVar6)) goto LAB_0035e5d6;
              Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar6,vFanins_00);
              if ((long)vFanins->nSize <= (long)uVar12) goto LAB_0035e633;
              vFanins->pArray[uVar12] = uVar6;
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
          }
        }
      }
      uVar13 = Wlc_ObjAlloc(pNew,0x17,0,iVar10 + -1,0);
      if ((0 < (int)uVar13) && ((int)uVar13 < pNew->nObjsAlloc)) {
        Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar13,vFanins);
        if ((p->vCopies).nSize <= iObj) {
LAB_0035e633:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCopies).pArray[(uint)iObj] = uVar13;
        if (vFanins_00->pArray != (int *)0x0) {
          free(vFanins_00->pArray);
        }
        free(vFanins_00);
        if (p_00->pArray != (int *)0x0) {
          free(p_00->pArray);
        }
LAB_0035e5ba:
        free(p_00);
        return;
      }
    }
  }
LAB_0035e5d6:
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Memory blasting.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkMemBlast_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkMemBlast_rec( pNew, p, iFanin, vFanins );
    if ( pObj->Type == WLC_OBJ_WRITE )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Vec_Int_t * vBits = Vec_IntAlloc( 100 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        Wlc_Obj_t * pData = Wlc_ObjFanin2(p, pObj);
        int DataW = Wlc_ObjRange(pData);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew, iObjDec;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        assert( Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem) );
        // create decoder
        iObjDec = Wlc_ObjAlloc( pNew, WLC_OBJ_DEC, 0, nRegs-1, 0 );
        Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjDec), vTemp );
        // create decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i, i );
            Vec_IntFill( vTemp, 1, iObjDec );
            Vec_IntPushTwo( vTemp, i, i );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vBits, iObj2 );
        }
        // create data words
        Vec_IntClear( vFanins );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        // create MUXes of data words controlled by decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
            Vec_IntFill( vTemp, 1, Vec_IntEntry(vBits, i) );
            Vec_IntPushTwo( vTemp, Wlc_ObjCopy(p, Wlc_ObjId(p, pData)), Vec_IntEntry(vFanins, i) );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntWriteEntry( vFanins, i, iObj2 );
        }
        // concatenate the results
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_CONCAT, 0, nRegs*DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
        Vec_IntFree( vBits );
    }
    else if ( pObj->Type == WLC_OBJ_READ )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        int DataW = Wlc_ObjRange(pObj);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        Vec_IntClear( vFanins );
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
    }
    else
        Wlc_ObjDup( pNew, p, iObj, vFanins );
}